

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O3

void __thiscall duckdb::TableStatistics::CopyStats(TableStatistics *this,TableStatistics *other)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  TableStatistics *lock;
  
  lock = other;
  __mutex = (pthread_mutex_t *)shared_ptr<std::mutex,_true>::operator*(&this->stats_lock);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    CopyStats(this,(TableStatisticsLock *)lock,other);
    pthread_mutex_unlock(__mutex);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void TableStatistics::CopyStats(TableStatistics &other) {
	TableStatisticsLock lock(*stats_lock);
	CopyStats(lock, other);
}